

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void pick_sb_modes_nonrd(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
                        RD_STATS *rd_cost,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx)

{
  uint8_t uVar1;
  AQ_MODE aq_mode;
  ushort uVar2;
  int iVar3;
  int iVar4;
  SequenceHeader *pSVar5;
  MB_MODE_INFO **ppMVar6;
  MB_MODE_INFO *pMVar7;
  int64_t iVar8;
  int iVar9;
  uint8_t **ppuVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  RefCntBuffer *pRVar15;
  scale_factors *scale;
  ushort uVar16;
  uint uVar17;
  YV12_BUFFER_CONFIG *src;
  int *piVar18;
  scale_factors *psVar19;
  MB_MODE_INFO *mbmi;
  uint uVar20;
  MACROBLOCKD *xd;
  char cVar21;
  ulong uVar22;
  buf_2d *pbVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  uint thresh_exit_part [3];
  buf_2d yv12_mb [3];
  uint auStack_d8 [4];
  MACROBLOCKD *local_c8;
  MB_MODE_INFO *local_c0;
  MACROBLOCK *local_b8;
  ulong local_b0;
  undefined1 *local_a8;
  BLOCK_SIZE (*local_a0) [2] [2];
  buf_2d local_98 [3];
  
  uVar22 = (ulong)bsize;
  if ((((cpi->common).seq_params)->sb_size != bsize) ||
     ((cpi->sf).rt_sf.nonrd_check_partition_split == 1)) {
    av1_set_offsets(cpi,&tile_data->tile_info,x,mi_row,mi_col,bsize);
  }
  mbmi = *(x->e_mbd).mi;
  if ((cpi->common).seg.enabled == '\0') {
    bVar26 = true;
  }
  else {
    bVar26 = ((cpi->common).seg.feature_mask[*(ushort *)&mbmi->field_0xa7 & 7] & 0x40) == 0;
  }
  uVar1 = ((cpi->common).seq_params)->monochrome;
  aq_mode = (cpi->oxcf).q_cfg.aq_mode;
  pSVar5 = (cpi->common).seq_params;
  uVar17 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
           [pSVar5->sb_size] - 1;
  if (((uVar17 & mi_row) == 0) &&
     ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pSVar5->sb_size] <=
      (int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [uVar22] + (uVar17 & mi_col)))) {
    bVar11 = (byte)pSVar5->mib_size_log2;
    (*(cpi->mt_info).enc_row_mt.sync_read_ptr)
              (&tile_data->row_mt_sync,
               mi_row - (tile_data->tile_info).mi_row_start >> (bVar11 & 0x1f),
               mi_col - (tile_data->tile_info).mi_col_start >> (bVar11 & 0x1f));
  }
  xd = &x->e_mbd;
  (x->e_mbd).tx_type_map = (x->txfm_search_info).tx_type_map_;
  (x->e_mbd).tx_type_map_stride =
       (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar22];
  ppuVar10 = &x->plane[0].txb_entropy_ctx;
  uVar24 = 0;
  do {
    ppuVar10[-2] = (uint8_t *)ctx->coeff[uVar24];
    ppuVar10[-3] = (uint8_t *)ctx->qcoeff[uVar24];
    ppuVar10[-4] = (uint8_t *)ctx->dqcoeff[uVar24];
    ppuVar10[-1] = (uint8_t *)ctx->eobs[uVar24];
    *ppuVar10 = ctx->txb_entropy_ctx[uVar24];
    if (uVar1 != '\0') break;
    ppuVar10 = ppuVar10 + 0x11;
    bVar25 = uVar24 < 2;
    uVar24 = uVar24 + 1;
  } while (bVar25);
  ppuVar10 = &(x->e_mbd).plane[0].color_index_map;
  lVar14 = 0x21;
  do {
    *ppuVar10 = *(uint8_t **)((ctx->mic).mv + lVar14 * 2 + -2);
    lVar14 = lVar14 + 1;
    ppuVar10 = ppuVar10 + 0x146;
  } while (lVar14 == 0x22);
  if (bVar26) {
    uVar17 = x->force_zeromv_skip_for_sb;
    if (1 < (int)uVar17) {
      pSVar5 = (cpi->common).seq_params;
      uVar17 = 0;
      if (pSVar5->sb_size != bsize) {
        uVar17 = (uint)(pSVar5->monochrome == '\0') * 2 + 1;
        auStack_d8[1] = cpi->zeromv_skip_thresh_exit_part[uVar22];
        auStack_d8[2] = auStack_d8[1] * 3 >> 2;
        iVar3 = (cpi->common).remapped_ref_idx[0];
        lVar14 = (long)iVar3;
        if (lVar14 == -1) {
          pRVar15 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar15 = (cpi->common).ref_frame_map[lVar14];
        }
        src = &pRVar15->buf;
        if (pRVar15 == (RefCntBuffer *)0x0) {
          src = (YV12_BUFFER_CONFIG *)0x0;
        }
        psVar19 = (scale_factors *)0x0;
        scale = (cpi->common).ref_scale_factors + lVar14;
        if (iVar3 == -1) {
          scale = psVar19;
        }
        auStack_d8[3] = auStack_d8[2];
        local_c8 = xd;
        local_c0 = mbmi;
        av1_setup_pred_block(xd,local_98,src,scale,scale,uVar17);
        local_b0 = (ulong)uVar17;
        local_a8 = (undefined1 *)(ulong)(uVar17 * 8);
        pbVar23 = &x->plane[0].src;
        local_b8 = x;
        piVar18 = &(x->e_mbd).plane[0].subsampling_y;
        uVar24 = 1;
        local_a0 = av1_ss_size_lookup + uVar22;
        bVar25 = false;
        do {
          uVar17 = (*cpi->ppi->fn_ptr[(*local_a0)[piVar18[-1]][*piVar18]].sdf)
                             (pbVar23->buf,pbVar23->stride,
                              *(uint8_t **)((long)&local_98[0].buf + (long)psVar19 * 4),
                              (&local_98[0].stride)[(long)psVar19]);
          if (auStack_d8[uVar24] <= uVar17) break;
          bVar25 = local_b0 <= uVar24;
          psVar19 = (scale_factors *)&psVar19->x_step_q4;
          uVar24 = uVar24 + 1;
          pbVar23 = (buf_2d *)((long)(pbVar23 + 4) + 8);
          piVar18 = piVar18 + 0x28c;
        } while ((scale_factors *)local_a8 != psVar19);
        uVar17 = (uint)bVar25;
        mbmi = local_c0;
        xd = local_c8;
        x = local_b8;
      }
    }
    x->force_zeromv_skip_for_blk = uVar17;
    if ((uVar17 == 0) &&
       ((x->source_variance == 0xffffffff || (bsize < ((cpi->common).seq_params)->sb_size)))) {
      uVar17 = av1_get_perpixel_variance_facade(cpi,xd,&x->plane[0].src,bsize,0);
      x->source_variance = uVar17;
    }
  }
  iVar3 = x->rdmult;
  setup_block_rdmult(cpi,x,mi_row,mi_col,bsize,aq_mode,mbmi);
  iVar9 = x->rdmult >> 6;
  iVar12 = 1;
  if (1 < iVar9) {
    iVar12 = iVar9;
  }
  x->errorperbit = iVar12;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    lVar14 = (long)(cpi->sf).rt_sf.hybrid_intra_pickmode;
    if ((bsize < BLOCK_16X16 && lVar14 != 0) &&
       (*(uint *)(partition_context_lookup + lVar14 * 2 + 0x14) <= x->source_variance)) {
      av1_rd_pick_intra_mode_sb(cpi,x,rd_cost,bsize,ctx,0x7fffffffffffffff);
    }
    else {
      av1_nonrd_pick_intra_mode(cpi,x,rd_cost,bsize,ctx);
    }
  }
  else {
    if (!bVar26) {
      x->force_zeromv_skip_for_blk = 1;
    }
    av1_nonrd_pick_inter_mode_sb(cpi,tile_data,x,rd_cost,bsize,ctx);
  }
  iVar12 = (cpi->sf).rt_sf.skip_cdef_sb;
  if (iVar12 == 0) goto LAB_001e4183;
  bVar25 = true;
  if (bVar26) {
    if ((((cpi->rc).frames_since_key < 0xb) || ((cpi->rc).high_source_sad != 0)) ||
       (x->color_sensitivity[0] != '\0')) {
      bVar25 = false;
    }
    else {
      bVar25 = x->color_sensitivity[1] == '\0';
    }
  }
  uVar17 = mi_row + 0xf;
  if (-1 < mi_row) {
    uVar17 = mi_row;
  }
  uVar20 = mi_col + 0xf;
  if (-1 < mi_col) {
    uVar20 = mi_col;
  }
  ppMVar6 = (cpi->common).mi_params.mi_grid_base;
  iVar13 = (uVar17 >> 4) * (cpi->common).mi_params.mi_stride * 0x10 + (uVar20 & 0xfffffff0);
  iVar9 = (cpi->common).width;
  iVar4 = (cpi->common).height;
  if (iVar9 < iVar4) {
    iVar4 = iVar9;
  }
  uVar17 = 0xffffffff;
  if ((10 < (cpi->oxcf).speed) && (iVar4 < 0x2d0)) {
    uVar17 = -(uint)((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) | 400;
  }
  pMVar7 = ppMVar6[iVar13];
  uVar2 = *(ushort *)&pMVar7->field_0xa7;
  cVar21 = (char)((uint)(int)(short)(uVar2 * 2) >> 0xc);
  if (iVar12 < 2) {
    if ((bool)(cVar21 != '\0' & bVar25)) {
      uVar16 = 0x800;
      if (uVar17 <= x->source_variance) goto LAB_001e414a;
      if (0xc < mbmi->mode) {
        uVar16 = (ushort)(mbmi->mode != 0x10);
        goto LAB_001e4147;
      }
    }
    uVar16 = 0;
  }
  else {
    if ((bool)(cVar21 == '\0' | bVar25)) {
      uVar16 = (ushort)(cVar21 != '\0');
    }
    else {
      uVar16 = (ushort)(x->source_variance == 0);
    }
LAB_001e4147:
    uVar16 = uVar16 << 0xb;
  }
LAB_001e414a:
  *(ushort *)&pMVar7->field_0xa7 = uVar16 | uVar2 & 0x87ff;
  *(ushort *)&(ctx->mic).field_0xa7 =
       *(ushort *)&(ctx->mic).field_0xa7 & 0x87ff | *(ushort *)&ppMVar6[iVar13]->field_0xa7 & 0x7800
  ;
LAB_001e4183:
  x->rdmult = iVar3;
  (ctx->rd_stats).rate = rd_cost->rate;
  iVar8 = rd_cost->rdcost;
  (ctx->rd_stats).dist = rd_cost->dist;
  (ctx->rd_stats).rdcost = iVar8;
  return;
}

Assistant:

static void pick_sb_modes_nonrd(AV1_COMP *const cpi, TileDataEnc *tile_data,
                                MACROBLOCK *const x, int mi_row, int mi_col,
                                RD_STATS *rd_cost, BLOCK_SIZE bsize,
                                PICK_MODE_CONTEXT *ctx) {
  // For nonrd mode, av1_set_offsets is already called at the superblock level
  // in encode_nonrd_sb when we determine the partitioning.
  if (bsize != cpi->common.seq_params->sb_size ||
      cpi->sf.rt_sf.nonrd_check_partition_split == 1) {
    av1_set_offsets(cpi, &tile_data->tile_info, x, mi_row, mi_col, bsize);
  }
  assert(x->last_set_offsets_loc.mi_row == mi_row &&
         x->last_set_offsets_loc.mi_col == mi_col &&
         x->last_set_offsets_loc.bsize == bsize);
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const AQ_MODE aq_mode = cpi->oxcf.q_cfg.aq_mode;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int i;
  const int seg_skip =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP);

  // This is only needed for real time/allintra row-mt enabled multi-threaded
  // encoding with cost update frequency set to COST_UPD_TILE/COST_UPD_OFF.
  wait_for_top_right_sb(&cpi->mt_info.enc_row_mt, &tile_data->row_mt_sync,
                        &tile_data->tile_info, cm->seq_params->sb_size,
                        cm->seq_params->mib_size_log2, bsize, mi_row, mi_col);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, pick_sb_modes_nonrd_time);
#endif
  // Sets up the tx_type_map buffer in MACROBLOCKD.
  xd->tx_type_map = txfm_info->tx_type_map_;
  xd->tx_type_map_stride = mi_size_wide[bsize];
  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }
  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];

  if (!seg_skip) {
    x->force_zeromv_skip_for_blk =
        get_force_zeromv_skip_flag_for_blk(cpi, x, bsize);

    // Source variance may be already compute at superblock level, so no need
    // to recompute, unless bsize < sb_size or source_variance is not yet set.
    if (!x->force_zeromv_skip_for_blk &&
        (x->source_variance == UINT_MAX || bsize < cm->seq_params->sb_size))
      x->source_variance = av1_get_perpixel_variance_facade(
          cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, aq_mode, mbmi);
  // Set error per bit for current rdmult
  av1_set_error_per_bit(&x->errorperbit, x->rdmult);
  // Find best coding mode & reconstruct the MB so it is available
  // as a predictor for MBs that follow in the SB
  if (frame_is_intra_only(cm)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, hybrid_intra_mode_search_time);
#endif
    hybrid_intra_mode_search(cpi, x, rd_cost, bsize, ctx);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, hybrid_intra_mode_search_time);
#endif
  } else {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, nonrd_pick_inter_mode_sb_time);
#endif
    if (seg_skip) {
      x->force_zeromv_skip_for_blk = 1;
      // TODO(marpan): Consider adding a function for nonrd:
      // av1_nonrd_pick_inter_mode_sb_seg_skip(), instead of setting
      // x->force_zeromv_skip flag and entering av1_nonrd_pick_inter_mode_sb().
    }
    av1_nonrd_pick_inter_mode_sb(cpi, tile_data, x, rd_cost, bsize, ctx);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, nonrd_pick_inter_mode_sb_time);
#endif
  }
  if (cpi->sf.rt_sf.skip_cdef_sb) {
    // cdef_strength is initialized to 1 which means skip_cdef, and is updated
    // here. Check to see is skipping cdef is allowed. Never skip on slide/scene
    // change, near a key frame, or when color sensitivity is set. Always allow
    // cdef_skip for seg_skip = 1.
    const int allow_cdef_skipping =
        seg_skip ||
        (cpi->rc.frames_since_key > 10 && !cpi->rc.high_source_sad &&
         !(x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] ||
           x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]));

    // Find the corresponding 64x64 block. It'll be the 128x128 block if that's
    // the block size.
    const int mi_row_sb = mi_row - mi_row % MI_SIZE_64X64;
    const int mi_col_sb = mi_col - mi_col % MI_SIZE_64X64;
    MB_MODE_INFO **mi_sb =
        cm->mi_params.mi_grid_base +
        get_mi_grid_idx(&cm->mi_params, mi_row_sb, mi_col_sb);
    const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
    unsigned int thresh_spatial_var =
        (cpi->oxcf.speed >= 11 && !is_720p_or_larger &&
         cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN)
            ? 400
            : UINT_MAX;
    // For skip_cdef_sb = 1: do not skip if allow_cdef_skipping is false or
    // intra or new mv is picked, with possible conidition on spatial variance.
    // For skip_cdef_sb >= 2: more aggressive mode to always skip unless
    // allow_cdef_skipping is false and source_variance is non-zero.
    if (cpi->sf.rt_sf.skip_cdef_sb >= 2) {
      mi_sb[0]->cdef_strength =
          mi_sb[0]->cdef_strength &&
          (allow_cdef_skipping || x->source_variance == 0);
    } else {
      mi_sb[0]->cdef_strength =
          mi_sb[0]->cdef_strength && allow_cdef_skipping &&
          !(x->source_variance < thresh_spatial_var &&
            (mbmi->mode < INTRA_MODES || mbmi->mode == NEWMV));
    }
    // Store in the pickmode context.
    ctx->mic.cdef_strength = mi_sb[0]->cdef_strength;
  }
  x->rdmult = orig_rdmult;
  ctx->rd_stats.rate = rd_cost->rate;
  ctx->rd_stats.dist = rd_cost->dist;
  ctx->rd_stats.rdcost = rd_cost->rdcost;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, pick_sb_modes_nonrd_time);
#endif
}